

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_arithmetic.c
# Opt level: O3

void binop1_pow_bang(t_binop *x)

{
  float __x;
  float __y;
  float f;
  
  __x = x->x_f1;
  f = 0.0;
  if (((__x != 0.0) || (NAN(__x))) || (0.0 < x->x_f2 || x->x_f2 == 0.0)) {
    __y = x->x_f2;
    if (__x < 0.0) {
      f = 0.0;
      if ((__y != (float)(int)__y) || (NAN(__y) || NAN((float)(int)__y))) goto LAB_00179a36;
    }
    f = powf(__x,__y);
  }
LAB_00179a36:
  outlet_float((x->x_obj).te_outlet,f);
  return;
}

Assistant:

static void binop1_pow_bang(t_binop *x)
{
    t_float r = (x->x_f1 == 0 && x->x_f2 < 0) ||
        (x->x_f1 < 0 && (x->x_f2 - (int)x->x_f2) != 0) ?
            0 : POW(x->x_f1, x->x_f2);
    outlet_float(x->x_obj.ob_outlet, r);
}